

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

POMDPXState * __thiscall
despot::MemoryPool<despot::POMDPXState>::Allocate(MemoryPool<despot::POMDPXState> *this)

{
  pointer ppPVar1;
  POMDPXState *pPVar2;
  
  if ((this->freelist_).
      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->freelist_).
      super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    NewChunk(this);
  }
  ppPVar1 = (this->freelist_).
            super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pPVar2 = ppPVar1[-1];
  (this->freelist_).
  super__Vector_base<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppPVar1 + -1;
  if ((pPVar2->super_State).super_MemoryObject.allocated_ != true) {
    (pPVar2->super_State).super_MemoryObject.allocated_ = true;
    this->num_allocated_ = this->num_allocated_ + 1;
    return pPVar2;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,
                "T *despot::MemoryPool<despot::POMDPXState>::Allocate() [T = despot::POMDPXState]");
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}